

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_xonly_pubkey_tweak_add_check
              (secp256k1_context *ctx,uchar *tweaked_pubkey32,int tweaked_pk_parity,
              secp256k1_xonly_pubkey *internal_pubkey,uchar *tweak32)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  int extraout_EAX;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uchar *seckey;
  uchar *p1;
  ulong uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  secp256k1_fe *r;
  uint64_t uVar16;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx;
  uchar *p2;
  uint uVar17;
  undefined1 auVar18 [16];
  uchar pk_expected32 [32];
  secp256k1_ge pk;
  uint auStack_194 [15];
  secp256k1_ge sStack_158;
  secp256k1_fe *psStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  uchar local_a8 [32];
  secp256k1_ge local_88;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_xonly_pubkey_tweak_add_check_cold_5();
  }
  else if (internal_pubkey != (secp256k1_xonly_pubkey *)0x0) {
    if (tweaked_pubkey32 == (uchar *)0x0) {
      secp256k1_xonly_pubkey_tweak_add_check_cold_3();
      return 0;
    }
    if (tweak32 == (uchar *)0x0) {
      secp256k1_xonly_pubkey_tweak_add_check_cold_2();
      return 0;
    }
    iVar7 = secp256k1_pubkey_load(ctx,&local_88,(secp256k1_pubkey *)internal_pubkey);
    if (iVar7 == 0) {
      return 0;
    }
    iVar7 = secp256k1_ec_pubkey_tweak_add_helper(&local_88,tweak32);
    if (iVar7 != 0) {
      secp256k1_fe_normalize_var(&local_88.x);
      r = &local_88.y;
      secp256k1_fe_normalize_var(r);
      secp256k1_fe_get_b32(local_a8,&local_88.x);
      lVar8 = 0;
      do {
        if (local_a8[lVar8] != tweaked_pubkey32[lVar8]) {
          return 0;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x20);
      secp256k1_fe_verify(r);
      if (local_88.y.normalized != 0) {
        return (uint)(((uint)local_88.y.n[0] & 1) == tweaked_pk_parity);
      }
      secp256k1_xonly_pubkey_tweak_add_check_cold_1();
      secp256k1_fe_verify(r);
      uVar9 = (r->n[4] >> 0x30) * 0x1000003d1 + r->n[0];
      uVar10 = (uVar9 >> 0x34) + r->n[1];
      uVar9 = uVar9 & 0xfffffffffffff;
      uVar12 = (uVar10 >> 0x34) + r->n[2];
      uVar13 = (uVar12 >> 0x34) + r->n[3];
      uVar12 = uVar12 & 0xfffffffffffff;
      uVar16 = (uVar13 >> 0x34) + (r->n[4] & 0xffffffffffff);
      uVar11 = uVar10 & 0xfffffffffffff;
      uVar14 = uVar13 & 0xfffffffffffff;
      if (0xffffefffffc2e < uVar9 &&
          ((uVar12 & uVar10 & uVar13) == 0xfffffffffffff && uVar16 == 0xffffffffffff) ||
          uVar16 >> 0x30 != 0) {
        uVar11 = uVar11 + (uVar9 + 0x1000003d1 >> 0x34);
        uVar12 = uVar12 + (uVar11 >> 0x34);
        pauVar15 = (undefined1 (*) [16])(uVar14 + (uVar12 >> 0x34));
        uVar10 = ((ulong)pauVar15 >> 0x34) + uVar16;
        ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(uVar10 & 0x3000000000000);
        if (ecmult_gen_ctx != (secp256k1_ecmult_gen_context *)0x1000000000000) {
          secp256k1_fe_normalize_var_cold_1();
          uStack_e0 = 0xfffffffffffff;
          uStack_e8 = 0xffffffffffff;
          psStack_f0 = r;
          if (ecmult_gen_ctx == (secp256k1_ecmult_gen_context *)0x0) {
            secp256k1_keypair_create_cold_4();
          }
          else if (pauVar15 != (undefined1 (*) [16])0x0) {
            pauVar15[5] = (undefined1  [16])0x0;
            pauVar15[4] = (undefined1  [16])0x0;
            pauVar15[3] = (undefined1  [16])0x0;
            pauVar15[2] = (undefined1  [16])0x0;
            pauVar15[1] = (undefined1  [16])0x0;
            *pauVar15 = (undefined1  [16])0x0;
            if (ecmult_gen_ctx->built == 0) {
              secp256k1_keypair_create_cold_2();
              return 0;
            }
            if (seckey == (uchar *)0x0) {
              secp256k1_keypair_create_cold_1();
              return 0;
            }
            iVar7 = secp256k1_ec_pubkey_create_helper(ecmult_gen_ctx,auStack_194,&sStack_158,seckey)
            ;
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)auStack_194[0]);
            *(undefined1 (*) [16])(*pauVar15 + 0xc) = (undefined1  [16])0x0;
            *pauVar15 = (undefined1  [16])0x0;
            *(uint *)(pauVar15[1] + 0xc) =
                 auStack_194[0] >> 0x18 | (auStack_194[0] & 0xff0000) >> 8 |
                 (auStack_194[0] & 0xff00) << 8 | auStack_194[0] << 0x18;
            secp256k1_ge_to_bytes((uchar *)(pauVar15 + 2),&sStack_158);
            cVar6 = ((byte)iVar7 ^ 1) - 1;
            auVar18 = ZEXT216(CONCAT11(cVar6,cVar6));
            auVar18 = pshuflw(auVar18,auVar18,0);
            uVar17 = auVar18._0_4_;
            lVar8 = 0;
            do {
              puVar1 = (uint *)(*pauVar15 + lVar8);
              uVar3 = puVar1[1];
              uVar4 = puVar1[2];
              uVar5 = puVar1[3];
              puVar2 = (uint *)(*pauVar15 + lVar8);
              *puVar2 = *puVar1 & uVar17;
              puVar2[1] = uVar3 & uVar17;
              puVar2[2] = uVar4 & uVar17;
              puVar2[3] = uVar5 & uVar17;
              lVar8 = lVar8 + 0x10;
            } while (lVar8 != 0x60);
            return iVar7;
          }
          secp256k1_keypair_create_cold_3();
          return 0;
        }
        uVar14 = (ulong)pauVar15 & 0xfffffffffffff;
        uVar12 = uVar12 & 0xfffffffffffff;
        uVar11 = uVar11 & 0xfffffffffffff;
        uVar9 = uVar9 + 0x1000003d1 & 0xfffffffffffff;
        uVar16 = uVar10 & 0xffffffffffff;
      }
      r->n[0] = uVar9;
      r->n[1] = uVar11;
      r->n[2] = uVar12;
      r->n[3] = uVar14;
      r->n[4] = uVar16;
      r->magnitude = 1;
      r->normalized = 1;
      secp256k1_fe_verify(r);
      return extraout_EAX;
    }
    return 0;
  }
  secp256k1_xonly_pubkey_tweak_add_check_cold_4();
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_tweak_add_check(const secp256k1_context* ctx, const unsigned char *tweaked_pubkey32, int tweaked_pk_parity, const secp256k1_xonly_pubkey *internal_pubkey, const unsigned char *tweak32) {
    secp256k1_ge pk;
    unsigned char pk_expected32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(internal_pubkey != NULL);
    ARG_CHECK(tweaked_pubkey32 != NULL);
    ARG_CHECK(tweak32 != NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, internal_pubkey)
        || !secp256k1_ec_pubkey_tweak_add_helper(&pk, tweak32)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&pk.x);
    secp256k1_fe_normalize_var(&pk.y);
    secp256k1_fe_get_b32(pk_expected32, &pk.x);

    return secp256k1_memcmp_var(&pk_expected32, tweaked_pubkey32, 32) == 0
            && secp256k1_fe_is_odd(&pk.y) == tweaked_pk_parity;
}